

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

int SSL_renegotiate(SSL *s)

{
  bool bVar1;
  int iVar2;
  unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> local_20;
  SSL *local_18;
  SSL *ssl_local;
  
  local_18 = s;
  if ((*(ushort *)(s->handshake_func + 0xdc) >> 0xb & 1) == 0) {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                  ,0x65d);
    ssl_local._4_4_ = 0;
  }
  else {
    bVar1 = bssl::ssl_can_renegotiate((SSL *)s);
    if (bVar1) {
      iVar2 = SSL_can_release_private_key((SSL *)local_18);
      if (iVar2 != 0) {
        __assert_fail("!SSL_can_release_private_key(ssl)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                      ,0x667,"int SSL_renegotiate(SSL *)");
      }
      bVar1 = bssl::SSLBuffer::empty((SSLBuffer *)(local_18->handshake_func + 0x68));
      if ((bVar1) && (*(int *)(local_18->handshake_func + 0xb0) == 0)) {
        bVar1 = std::operator!=((unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> *)
                                (local_18->handshake_func + 0x118),(nullptr_t)0x0);
        if (bVar1) {
          ERR_put_error(0x10,0,0x44,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                        ,0x675);
          ssl_local._4_4_ = 0;
        }
        else {
          bssl::ssl_handshake_new((bssl *)&local_20,(SSL *)local_18);
          std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator=
                    ((unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> *)
                     (local_18->handshake_func + 0x118),&local_20);
          std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::~unique_ptr(&local_20);
          bVar1 = std::operator==((unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> *)
                                  (local_18->handshake_func + 0x118),(nullptr_t)0x0);
          if (bVar1) {
            ssl_local._4_4_ = 0;
          }
          else {
            *(ushort *)(local_18->handshake_func + 0xdc) =
                 *(ushort *)(local_18->handshake_func + 0xdc) & 0xf7ff;
            *(int *)(local_18->handshake_func + 0xc0) =
                 *(int *)(local_18->handshake_func + 0xc0) + 1;
            ssl_local._4_4_ = 1;
          }
        }
      }
      else {
        ERR_put_error(0x10,0,0xb6,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                      ,0x66f);
        ssl_local._4_4_ = 0;
      }
    }
    else {
      ERR_put_error(0x10,0,0xb6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                    ,0x662);
      ssl_local._4_4_ = 0;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

int SSL_renegotiate(SSL *ssl) {
  // Caller-initiated renegotiation is not supported.
  if (!ssl->s3->renegotiate_pending) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  if (!ssl_can_renegotiate(ssl)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_NO_RENEGOTIATION);
    return 0;
  }

  // We should not have told the caller to release the private key.
  assert(!SSL_can_release_private_key(ssl));

  // Renegotiation is only supported at quiescent points in the application
  // protocol, namely in HTTPS, just before reading the HTTP response.
  // Require the record-layer be idle and avoid complexities of sending a
  // handshake record while an application_data record is being written.
  if (!ssl->s3->write_buffer.empty() ||
      ssl->s3->write_shutdown != ssl_shutdown_none) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_NO_RENEGOTIATION);
    return 0;
  }

  // Begin a new handshake.
  if (ssl->s3->hs != nullptr) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return 0;
  }
  ssl->s3->hs = ssl_handshake_new(ssl);
  if (ssl->s3->hs == nullptr) {
    return 0;
  }

  ssl->s3->renegotiate_pending = false;
  ssl->s3->total_renegotiations++;
  return 1;
}